

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

bool __thiscall slang::parsing::Preprocessor::isDefined(Preprocessor *this,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  byte bVar5;
  size_t __n;
  char *__s1;
  int iVar6;
  uint uVar7;
  uint64_t uVar8;
  long lVar9;
  size_type __rlen;
  undefined1 auVar10 [16];
  size_t pos;
  value_type *elements;
  ulong local_90;
  ulong local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_68._M_str = name._M_str;
  local_68._M_len = name._M_len;
  if (local_68._M_len != 0) {
    uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                      ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                       &this->macros,&local_68);
    __s1 = local_68._M_str;
    __n = local_68._M_len;
    local_90 = uVar8 >> ((byte)(this->macros).table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                               .arrays.groups_size_index & 0x3f);
    pgVar2 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_;
    local_58 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[uVar8 & 0xff];
    ppVar3 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.elements_;
    uVar4 = (this->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .arrays.groups_size_mask;
    local_88 = 0;
    uStack_54 = local_58;
    uStack_50 = local_58;
    uStack_4c = local_58;
    do {
      pgVar1 = pgVar2 + local_90;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      uStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      uStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      uStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bVar5 = pgVar1->m[0xf].n;
      auVar10[0] = -(local_48 == (uchar)local_58);
      auVar10[1] = -(uStack_47 == local_58._1_1_);
      auVar10[2] = -(uStack_46 == local_58._2_1_);
      auVar10[3] = -(uStack_45 == local_58._3_1_);
      auVar10[4] = -(uStack_44 == (uchar)uStack_54);
      auVar10[5] = -(uStack_43 == uStack_54._1_1_);
      auVar10[6] = -(uStack_42 == uStack_54._2_1_);
      auVar10[7] = -(uStack_41 == uStack_54._3_1_);
      auVar10[8] = -(uStack_40 == (uchar)uStack_50);
      auVar10[9] = -(uStack_3f == uStack_50._1_1_);
      auVar10[10] = -(uStack_3e == uStack_50._2_1_);
      auVar10[0xb] = -(uStack_3d == uStack_50._3_1_);
      auVar10[0xc] = -(uStack_3c == (uchar)uStack_4c);
      auVar10[0xd] = -(uStack_3b == uStack_4c._1_1_);
      auVar10[0xe] = -(uStack_3a == uStack_4c._2_1_);
      auVar10[0xf] = -(bVar5 == uStack_4c._3_1_);
      bStack_39 = bVar5;
      for (uVar7 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe); uVar7 != 0;
          uVar7 = uVar7 - 1 & uVar7) {
        iVar6 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (__n == *(size_t *)
                    ((long)&ppVar3[local_90 * 0xf].first._M_len + (ulong)(uint)(iVar6 << 5))) {
          if (__n == 0) {
            return true;
          }
          iVar6 = bcmp(__s1,*(void **)((long)&ppVar3[local_90 * 0xf].first._M_str +
                                      (ulong)(uint)(iVar6 << 5)),__n);
          if (iVar6 == 0) {
            return true;
          }
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bVar5) == 0) {
        return false;
      }
      lVar9 = local_90 + local_88;
      local_88 = local_88 + 1;
      local_90 = lVar9 + 1U & uVar4;
    } while (local_88 <= uVar4);
  }
  return false;
}

Assistant:

bool Preprocessor::isDefined(std::string_view name) {
    return !name.empty() && macros.find(name) != macros.end();
}